

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature.c
# Opt level: O2

int extractor(light_pcapng packet,void *data,size_t feature_count)

{
  byte bVar1;
  byte bVar2;
  uint32_t *puVar3;
  ushort uVar4;
  ulong uVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  char *__format;
  long lVar9;
  uint32_t *body;
  undefined4 *local_50;
  uint32_t *local_48;
  uint32_t type;
  size_t body_size;
  
  body = (uint32_t *)0x0;
  body_size = 0;
  type = 0xdeadbeef;
  light_get_block_info(packet,LIGHT_INFO_BODY,&body,&body_size);
  light_get_block_info(packet,LIGHT_INFO_TYPE,&type,(size_t *)0x0);
  puVar3 = body;
  if (type == 6) {
    local_48 = body;
    printf("HWaddr0: ");
    for (lVar9 = 0; (int)lVar9 != 6; lVar9 = lVar9 + 1) {
      printf("%x:",(ulong)*(byte *)((long)puVar3 + lVar9 + 0x14));
    }
    local_50 = (undefined4 *)data;
    putchar(10);
    printf("HWaddr1: ");
    lVar8 = -lVar9;
    for (lVar7 = 0; (int)lVar7 != 6; lVar7 = lVar7 + 1) {
      printf("%x:",(ulong)*(byte *)((long)puVar3 + lVar9 + lVar7 + 0x14));
      lVar8 = lVar8 + -1;
    }
    putchar(10);
    uVar4 = *(ushort *)((long)puVar3 + lVar9 + lVar7 + 0x14);
    uVar4 = uVar4 << 8 | uVar4 >> 8;
    pbVar6 = (byte *)((long)local_48 + (0x16 - lVar8));
    if (uVar4 != 0x800) {
      uVar5 = (ulong)uVar4;
      if (uVar4 == 0x8100) {
        pbVar6 = (byte *)((long)local_48 + (0x1a - lVar8));
      }
      else if (uVar4 == 0x9100) {
        pbVar6 = (byte *)((long)local_48 + (0x1c - lVar8));
      }
      else if (uVar4 != 0x86dd) {
        __format = "Unhandled Ethernet type(len) 0x%X\n";
        goto LAB_0010237b;
      }
    }
    bVar1 = *pbVar6;
    if (bVar1 >> 4 == 4) {
      bVar2 = pbVar6[9];
      printf("Packet total length = %u, protocol = %u\n",
             (ulong)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8),
             (ulong)bVar2);
      printf("Source address: ");
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        printf("%u.",(ulong)pbVar6[lVar9 + 0xc]);
      }
      putchar(10);
      printf("Destination address: ");
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        printf("%u.",(ulong)pbVar6[lVar9 + 0x10]);
      }
      putchar(10);
      if (bVar2 == 6) {
        uVar5 = (ulong)(byte)(bVar1 << 2);
        uVar4 = *(ushort *)(pbVar6 + uVar5) << 8 | *(ushort *)(pbVar6 + uVar5) >> 8;
        printf("TCP source: %u, destination: %u\n",(ulong)uVar4,
               (ulong)(ushort)(*(ushort *)(pbVar6 + uVar5 + 2) << 8 |
                              *(ushort *)(pbVar6 + uVar5 + 2) >> 8),(ulong)uVar4);
      }
      *local_50 = 0x3f800000;
    }
    else {
      printf("Protocol version = %u\n");
    }
    putchar(10);
  }
  else {
    if (type != 1) {
      return 0;
    }
    printf("Interface link type = 0x%X\n",(ulong)(ushort)*body);
    uVar5 = (ulong)puVar3[1];
    __format = "Interface snapshot length = %u\n";
LAB_0010237b:
    printf(__format,uVar5);
  }
  return 0;
}

Assistant:

static int extractor(const light_pcapng packet, void *data, size_t feature_count)
{
	float *features = (float *)data;
	uint32_t *body = NULL;
	size_t body_size = 0;
	uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;
	uint8_t protocol_version;
	uint8_t ip_header_length;
	uint16_t ethernet_type;
	struct _light_enhanced_packet_block *epb;
	uint8_t *octets;
	int i;

	light_get_block_info(packet, LIGHT_INFO_BODY, &body, &body_size);
	light_get_block_info(packet, LIGHT_INFO_TYPE, &type, NULL);

	if (type == LIGHT_INTERFACE_BLOCK) {
		struct _light_interface_description_block *idb = (struct _light_interface_description_block *)body;
		print_interface(idb);
		return 0;
	}
	else if (type != LIGHT_ENHANCED_PACKET_BLOCK /*&& type != LIGHT_SIMPLE_PACKET_BLOCK*/) {
		return 0;
	}

	epb = (struct _light_enhanced_packet_block *)body;
	octets = (uint8_t *)epb->packet_data;

	printf("HWaddr0: "); // Print destination address.
	for (i = 0; i < 6; ++i) {
		uint8_t byte = *octets++;
		printf("%x:", byte);
	}
	printf("\n");

	printf("HWaddr1: "); // Print host address.
	for (i = 0; i < 6; ++i) {
		uint8_t byte = *octets++;
		printf("%x:", byte);
	}
	printf("\n");

	ethernet_type = ntohs(*(uint16_t*)(octets));
	octets += 2; // Skip rest of Ethernet header.

	switch (ethernet_type) {
	case 0x0800: // Internet Protocol v4
	case 0x86DD: // Internet Protocol v6
		break;
	case 0x8100: // 802.1Q Virtual LAN
		octets += 4;
		break;
	case 0x9100: // 802.1Q DoubleTag
		octets += 6;
		break;
	default:
		printf("Unhandled Ethernet type(len) 0x%X\n", ethernet_type);
		return 0;
	}

	ip_header_length = (*octets) & 0b1111;
	protocol_version = (*octets >> 4) & 0b1111;

	if (protocol_version == 4) {
		__handle_ipv4(octets, ip_header_length);
		features[FEATURE_PROTOCOL] = 1.0;
	}
	else {
		// TODO;
		printf("Protocol version = %u\n", protocol_version);
	}

	printf("\n");
	return 0;
}